

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int lyxp_eval(char *expr,lyd_node *cur_node,lyxp_node_type cur_node_type,lys_module *param_4,
             lyxp_set *set,int options)

{
  int local_58;
  uint16_t local_52;
  int rc;
  uint16_t exp_idx;
  lyxp_expr *exp;
  ly_ctx *ctx;
  lyxp_set *plStack_38;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *plStack_20;
  lyxp_node_type cur_node_type_local;
  lyd_node *cur_node_local;
  char *expr_local;
  
  local_52 = 0;
  ctx._4_4_ = options;
  plStack_38 = set;
  set_local = (lyxp_set *)param_4;
  local_mod_local._4_4_ = cur_node_type;
  plStack_20 = cur_node;
  cur_node_local = (lyd_node *)expr;
  if (((expr == (char *)0x0) || (param_4 == (lys_module *)0x0)) || (set == (lyxp_set *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyxp_eval");
    expr_local._4_4_ = 1;
  }
  else {
    exp = (lyxp_expr *)param_4->ctx;
    _rc = lyxp_parse_expr((ly_ctx *)exp,expr);
    if (_rc == (lyxp_expr *)0x0) {
      local_58 = -1;
    }
    else {
      local_58 = reparse_or_expr((ly_ctx *)exp,_rc,&local_52);
      if (local_58 == 0) {
        if (local_52 < _rc->used) {
          ly_vlog((ly_ctx *)exp,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
                  _rc->expr + _rc->expr_pos[local_52]);
          ly_vlog((ly_ctx *)exp,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                  "Unparsed characters \"%s\" left at the end of an XPath expression.",
                  _rc->expr + _rc->expr_pos[local_52]);
          local_58 = -1;
        }
        else {
          print_expr_struct_debug(_rc);
          local_52 = 0;
          memset(plStack_38,0,0x40);
          plStack_38->type = LYXP_SET_EMPTY;
          if (plStack_20 != (lyd_node *)0x0) {
            set_insert_node(plStack_38,plStack_20,0,local_mod_local._4_4_,0);
          }
          local_58 = eval_expr_select(_rc,&local_52,LYXP_EXPR_NONE,plStack_20,
                                      (lys_module *)set_local,plStack_38,ctx._4_4_);
          if (local_58 == 2) {
            local_58 = 0;
          }
          if ((local_58 == -1) && (plStack_20 != (lyd_node *)0x0)) {
            ly_vlog((ly_ctx *)exp,LYE_PATH,LY_VLOG_LYD,plStack_20);
            lyxp_set_cast(plStack_38,LYXP_SET_EMPTY,plStack_20,(lys_module *)set_local,ctx._4_4_);
          }
        }
      }
    }
    lyxp_expr_free(_rc);
    expr_local._4_4_ = local_58;
  }
  return expr_local._4_4_;
}

Assistant:

int
lyxp_eval(const char *expr, const struct lyd_node *cur_node, enum lyxp_node_type cur_node_type,
          const struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    struct ly_ctx *ctx;
    struct lyxp_expr *exp;
    uint16_t exp_idx = 0;
    int rc = -1;

    if (!expr || !local_mod || !set) {
        LOGARG;
        return EXIT_FAILURE;
    }

    ctx = local_mod->ctx;

    exp = lyxp_parse_expr(ctx, expr);
    if (!exp) {
        rc = -1;
        goto finish;
    }

    rc = reparse_or_expr(ctx, exp, &exp_idx);
    if (rc) {
        goto finish;
    } else if (exp->used > exp_idx) {
        LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[exp_idx]]);
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Unparsed characters \"%s\" left at the end of an XPath expression.",
               &exp->expr[exp->expr_pos[exp_idx]]);
        rc = -1;
        goto finish;
    }

    print_expr_struct_debug(exp);

    exp_idx = 0;
    memset(set, 0, sizeof *set);
    set->type = LYXP_SET_EMPTY;
    if (cur_node) {
        set_insert_node(set, (struct lyd_node *)cur_node, 0, cur_node_type, 0);
    }

    rc = eval_expr_select(exp, &exp_idx, 0, (struct lyd_node *)cur_node, (struct lys_module *)local_mod, set, options);
    if (rc == 2) {
        rc = EXIT_SUCCESS;
    }
    if ((rc == -1) && cur_node) {
        LOGPATH(ctx, LY_VLOG_LYD, cur_node);
        lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    }

finish:
    lyxp_expr_free(exp);
    return rc;
}